

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

bool embree::operator==(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                        *a,vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                           *b)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  uint in_R8D;
  bool bVar6;
  
  if (a->size_active != b->size_active) {
    return false;
  }
  lVar4 = a->size_active + 1;
  lVar5 = 0;
  do {
    lVar4 = lVar4 + -1;
    bVar6 = lVar4 == 0;
    if (bVar6) {
      return bVar6;
    }
    pfVar1 = (float *)((long)&b->items->field_0 + lVar5);
    pfVar2 = (float *)((long)&a->items->field_0 + lVar5);
    lVar5 = lVar5 + 0x10;
    auVar3._4_4_ = -(uint)(pfVar1[1] != pfVar2[1]);
    auVar3._0_4_ = -(uint)(*pfVar1 != *pfVar2);
    auVar3._8_4_ = -(uint)(pfVar1[2] != pfVar2[2]);
    auVar3._12_4_ = -(uint)(pfVar1[3] != pfVar2[3]);
    in_R8D = movmskps(in_R8D,auVar3);
  } while ((in_R8D & 7) == 0);
  return bVar6;
}

Assistant:

__forceinline size_t size     () const { return size_active; }